

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void std::__reverse<QList<QString>::iterator>
               (QArrayDataPointer<char16_t> *__first,QArrayDataPointer<char16_t> *__last)

{
  if (__first != __last) {
    for (; __last = __last + -1, __first < __last; __first = __first + 1) {
      QArrayDataPointer<char16_t>::swap(__first,__last);
    }
  }
  return;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }